

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O2

void pffft_zreorder(PFFFT_Setup *setup,float *in,float *out,pffft_direction_t direction)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  int N;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  v4sf *out_00;
  long lVar14;
  long lVar15;
  int iVar16;
  
  if (in == out) {
    __assert_fail("in != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x51a,
                  "void pffft_zreorder(PFFFT_Setup *, const float *, float *, pffft_direction_t)");
  }
  if (setup->transform != PFFFT_REAL) {
    uVar3 = setup->Ncvec;
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    if (direction == PFFFT_FORWARD) {
      pfVar13 = in + 4;
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        iVar16 = ((uint)uVar12 & 3) * ((int)uVar3 / 4) + ((uint)(uVar12 >> 2) & 0x3fffffff);
        fVar4 = pfVar13[-4];
        fVar5 = pfVar13[-3];
        fVar6 = pfVar13[-1];
        fVar7 = *pfVar13;
        fVar8 = pfVar13[1];
        fVar9 = pfVar13[2];
        fVar10 = pfVar13[3];
        pfVar1 = out + (long)(iVar16 * 2 + 1) * 4;
        *pfVar1 = pfVar13[-2];
        pfVar1[1] = fVar9;
        pfVar1[2] = fVar6;
        pfVar1[3] = fVar10;
        pfVar1 = out + (long)(iVar16 * 2) * 4;
        *pfVar1 = fVar4;
        pfVar1[1] = fVar7;
        pfVar1[2] = fVar5;
        pfVar1[3] = fVar8;
        pfVar13 = pfVar13 + 8;
      }
    }
    else {
      pfVar13 = out + 4;
      for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        iVar16 = ((uint)uVar12 & 3) * ((int)uVar3 / 4) + ((uint)(uVar12 >> 2) & 0x3fffffff);
        pfVar1 = in + (long)(iVar16 * 2) * 4;
        fVar4 = *pfVar1;
        fVar5 = pfVar1[2];
        fVar6 = pfVar1[3];
        pfVar2 = in + (long)(iVar16 * 2 + 1) * 4;
        fVar7 = *pfVar2;
        fVar8 = pfVar2[1];
        fVar9 = pfVar2[2];
        fVar10 = pfVar2[3];
        *pfVar13 = pfVar1[1];
        pfVar13[1] = fVar6;
        pfVar13[2] = fVar8;
        pfVar13[3] = fVar10;
        pfVar13[-4] = fVar4;
        pfVar13[-3] = fVar5;
        pfVar13[-2] = fVar7;
        pfVar13[-1] = fVar9;
        pfVar13 = pfVar13 + 8;
      }
    }
    return;
  }
  iVar16 = setup->N;
  N = (int)((long)iVar16 / 0x20);
  uVar11 = 0;
  if (0 < N) {
    uVar11 = (long)iVar16 / 0x20 & 0xffffffff;
  }
  lVar14 = (long)(N * 4) * 0x10;
  if (direction != PFFFT_FORWARD) {
    pfVar13 = in + (long)(N * 4) * 4 + 4;
    for (lVar15 = 0; uVar11 * 0x20 != lVar15; lVar15 = lVar15 + 0x20) {
      pfVar1 = (float *)((long)in + lVar15);
      fVar4 = *pfVar1;
      fVar5 = pfVar1[2];
      fVar6 = pfVar1[3];
      pfVar2 = (float *)((long)in + lVar15 + 0x10);
      fVar7 = *pfVar2;
      fVar8 = pfVar2[1];
      fVar9 = pfVar2[2];
      fVar10 = pfVar2[3];
      pfVar2 = out + lVar15 + 4;
      *pfVar2 = pfVar1[1];
      pfVar2[1] = fVar6;
      pfVar2[2] = fVar8;
      pfVar2[3] = fVar10;
      pfVar1 = out + lVar15;
      *pfVar1 = fVar4;
      pfVar1[1] = fVar5;
      pfVar1[2] = fVar7;
      pfVar1[3] = fVar9;
      pfVar2 = (float *)((long)in + lVar15 + lVar14);
      fVar4 = *pfVar2;
      fVar5 = pfVar2[2];
      fVar6 = pfVar2[3];
      pfVar1 = (float *)((long)pfVar13 + lVar15);
      fVar7 = *pfVar1;
      fVar8 = pfVar1[1];
      fVar9 = pfVar1[2];
      fVar10 = pfVar1[3];
      pfVar1 = out + lVar15 + 0x14;
      *pfVar1 = pfVar2[1];
      pfVar1[1] = fVar6;
      pfVar1[2] = fVar8;
      pfVar1[3] = fVar10;
      pfVar1 = out + lVar15 + 0x10;
      *pfVar1 = fVar4;
      pfVar1[1] = fVar5;
      pfVar1[2] = fVar7;
      pfVar1[3] = fVar9;
    }
    unreversed_copy(N,(v4sf *)(in + iVar16 / 4),(v4sf *)(out + (long)iVar16 + -0x18),(int)pfVar13);
    unreversed_copy(N,(v4sf *)(in + (iVar16 * 3) / 4),(v4sf *)(out + (long)iVar16 + -8),(int)pfVar13
                   );
    return;
  }
  for (lVar15 = 0; uVar11 * 0x20 != lVar15; lVar15 = lVar15 + 0x20) {
    pfVar13 = in + lVar15;
    fVar4 = *pfVar13;
    fVar5 = pfVar13[1];
    fVar6 = pfVar13[3];
    pfVar1 = in + lVar15 + 4;
    fVar7 = *pfVar1;
    fVar8 = pfVar1[1];
    fVar9 = pfVar1[2];
    fVar10 = pfVar1[3];
    pfVar1 = (float *)((long)out + lVar15 + 0x10);
    *pfVar1 = pfVar13[2];
    pfVar1[1] = fVar9;
    pfVar1[2] = fVar6;
    pfVar1[3] = fVar10;
    pfVar13 = (float *)((long)out + lVar15);
    *pfVar13 = fVar4;
    pfVar13[1] = fVar7;
    pfVar13[2] = fVar5;
    pfVar13[3] = fVar8;
    pfVar1 = in + lVar15 + 0x10;
    fVar4 = *pfVar1;
    fVar5 = pfVar1[1];
    fVar6 = pfVar1[3];
    pfVar13 = in + lVar15 + 0x14;
    fVar7 = *pfVar13;
    fVar8 = pfVar13[1];
    fVar9 = pfVar13[2];
    fVar10 = pfVar13[3];
    pfVar13 = (float *)((long)out + lVar15 + lVar14 + 0x10);
    *pfVar13 = pfVar1[2];
    pfVar13[1] = fVar9;
    pfVar13[2] = fVar6;
    pfVar13[3] = fVar10;
    pfVar13 = (float *)((long)out + lVar15 + lVar14);
    *pfVar13 = fVar4;
    pfVar13[1] = fVar7;
    pfVar13[2] = fVar5;
    pfVar13[3] = fVar8;
  }
  out_00 = (v4sf *)0x2;
  reversed_copy(N,(v4sf *)(in + 8),(int)out + (iVar16 / 2) * 4,(v4sf *)0x2);
  reversed_copy(N,(v4sf *)(in + 0x18),(int)out + iVar16 * 4,out_00);
  return;
}

Assistant:

void pffft_zreorder(PFFFT_Setup *setup, const float *in, float *out, pffft_direction_t direction) {
  int k, N = setup->N, Ncvec = setup->Ncvec;
  const v4sf *vin = (const v4sf*)in;
  v4sf *vout = (v4sf*)out;
  assert(in != out);
  if (setup->transform == PFFFT_REAL) {
    int k, dk = N/32;
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < dk; ++k) {
        INTERLEAVE2(vin[k*8 + 0], vin[k*8 + 1], vout[2*(0*dk + k) + 0], vout[2*(0*dk + k) + 1]);
        INTERLEAVE2(vin[k*8 + 4], vin[k*8 + 5], vout[2*(2*dk + k) + 0], vout[2*(2*dk + k) + 1]);
      }
      reversed_copy(dk, vin+2, 8, (v4sf*)(out + N/2));
      reversed_copy(dk, vin+6, 8, (v4sf*)(out + N));
    } else {
      for (k=0; k < dk; ++k) {
        UNINTERLEAVE2(vin[2*(0*dk + k) + 0], vin[2*(0*dk + k) + 1], vout[k*8 + 0], vout[k*8 + 1]);
        UNINTERLEAVE2(vin[2*(2*dk + k) + 0], vin[2*(2*dk + k) + 1], vout[k*8 + 4], vout[k*8 + 5]);
      }
      unreversed_copy(dk, (v4sf*)(in + N/4), (v4sf*)(out + N - 6*SIMD_SZ), -8);
      unreversed_copy(dk, (v4sf*)(in + 3*N/4), (v4sf*)(out + N - 2*SIMD_SZ), -8);
    }
  } else {
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        INTERLEAVE2(vin[k*2], vin[k*2+1], vout[kk*2], vout[kk*2+1]);
      }
    } else {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        UNINTERLEAVE2(vin[kk*2], vin[kk*2+1], vout[k*2], vout[k*2+1]);
      }
    }
  }
}